

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::loadoccurrence(aalcalc *this)

{
  FILE *__stream;
  int date_opts;
  occurrence occ;
  
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream != (FILE *)0x0) {
    fread(&date_opts,4,1,__stream);
    if ((uint)date_opts < 2) {
      loadoccurrence<occurrence>(this,&occ,(FILE *)__stream);
    }
    else {
      loadoccurrence<occurrence_granular>(this,(occurrence_granular *)&occ,(FILE *)__stream);
    }
    return;
  }
  fprintf(_stderr,"FATAL: %s: cannot open %s\n","loadoccurrence","input/occurrence.bin");
  exit(-1);
}

Assistant:

void aalcalc::loadoccurrence()
{

	int date_opts;
	int granular_date = 0;
	FILE *fin = fopen(OCCURRENCE_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, OCCURRENCE_FILE);
		exit(-1);
	}
	fread(&date_opts, sizeof(date_opts), 1, fin);
	granular_date = date_opts >> 1;
	if (granular_date) {
		occurrence_granular occ;
		loadoccurrence(occ, fin);
	} else {
		occurrence occ;
		loadoccurrence(occ, fin);
	}

}